

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

int XXH128_cmp(void *h128_1,void *h128_2)

{
  int hcmp;
  XXH128_hash_t h2;
  XXH128_hash_t h1;
  void *h128_2_local;
  void *h128_1_local;
  undefined4 local_4;
  
  local_4 = (uint)(*(ulong *)((long)h128_2 + 8) < *(ulong *)((long)h128_1 + 8)) -
            (uint)(*(ulong *)((long)h128_1 + 8) < *(ulong *)((long)h128_2 + 8));
  if (local_4 == 0) {
    local_4 = (uint)(*h128_2 < *h128_1) - (uint)(*h128_1 < *h128_2);
  }
  return local_4;
}

Assistant:

XXH_PUBLIC_API int XXH128_cmp(XXH_NOESCAPE const void* h128_1, XXH_NOESCAPE const void* h128_2)
{
    XXH128_hash_t const h1 = *(const XXH128_hash_t*)h128_1;
    XXH128_hash_t const h2 = *(const XXH128_hash_t*)h128_2;
    int const hcmp = (h1.high64 > h2.high64) - (h2.high64 > h1.high64);
    /* note : bets that, in most cases, hash values are different */
    if (hcmp) return hcmp;
    return (h1.low64 > h2.low64) - (h2.low64 > h1.low64);
}